

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int rect_height_compare(void *a,void *b)

{
  int iVar1;
  uint uVar2;
  
  if (*(ushort *)((long)b + 6) < *(ushort *)((long)a + 6)) {
    iVar1 = -1;
  }
  else {
    if (*(ushort *)((long)b + 6) <= *(ushort *)((long)a + 6)) {
      uVar2 = 0xffffffff;
      if (*(ushort *)((long)a + 4) <= *(ushort *)((long)b + 4)) {
        uVar2 = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
      }
      return uVar2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int STBRP__CDECL rect_height_compare(const void *a, const void *b)
{
   const stbrp_rect *p = (const stbrp_rect *) a;
   const stbrp_rect *q = (const stbrp_rect *) b;
   if (p->h > q->h)
      return -1;
   if (p->h < q->h)
      return  1;
   return (p->w > q->w) ? -1 : (p->w < q->w);
}